

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameconfigfile.cpp
# Opt level: O3

void __thiscall FGameConfigFile::DoGameSetup(FGameConfigFile *this,char *gamename)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  size_t __n;
  char *pcVar3;
  char *pcVar4;
  FGameConfigFile *this_00;
  char *value;
  char *key;
  char *local_40;
  char *local_38;
  
  pcVar3 = this->section;
  iVar2 = mysnprintf(pcVar3,0x40,"%s.",gamename);
  __n = 0x3f - (long)iVar2;
  this->sublen = __n;
  this->subsection = this->section + iVar2;
  this->section[0x3f] = '\0';
  strncpy(this->section + iVar2,"UnknownConsoleVariables",__n);
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,pcVar3,false);
  if (bVar1) {
    ReadCVars(this,0);
  }
  strncpy(this->subsection,"ConsoleVariables",this->sublen);
  this_00 = this;
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,pcVar3,false);
  if (bVar1) {
    this_00 = this;
    ReadCVars(this,0);
  }
  if ((gameinfo.gametype & GAME_Raven) != GAME_Any) {
    SetRavenDefaults(this_00,gameinfo.gametype == GAME_Hexen);
  }
  strncpy(this->subsection,"LocalServerInfo",this->sublen);
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,pcVar3,false);
  if (bVar1) {
    ReadCVars(this,0);
  }
  strncpy(this->subsection,"Player",this->sublen);
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,pcVar3,false);
  if (bVar1) {
    ReadCVars(this,0);
  }
  strncpy(this->subsection,"ConsoleAliases",this->sublen);
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,pcVar3,false);
  if ((bVar1) &&
     (bVar1 = FConfigFile::NextInSection(&this->super_FConfigFile,&local_38,&local_40), bVar1)) {
    pcVar3 = (char *)0x0;
    do {
      __s1 = local_38;
      iVar2 = strcasecmp(local_38,"Name");
      pcVar4 = local_40;
      if ((iVar2 != 0) &&
         (iVar2 = strcasecmp(__s1,"Command"), pcVar4 = pcVar3, pcVar3 != (char *)0x0 && iVar2 == 0))
      {
        C_SetAlias(pcVar3,local_40);
        pcVar4 = (char *)0x0;
      }
      bVar1 = FConfigFile::NextInSection(&this->super_FConfigFile,&local_38,&local_40);
      pcVar3 = pcVar4;
    } while (bVar1);
  }
  (this->super_FConfigFile).OkayToWrite = true;
  return;
}

Assistant:

void FGameConfigFile::DoGameSetup (const char *gamename)
{
	const char *key;
	const char *value;

	sublen = countof(section) - 1 - mysnprintf (section, countof(section), "%s.", gamename);
	subsection = section + countof(section) - sublen - 1;
	section[countof(section) - 1] = '\0';
	
	strncpy (subsection, "UnknownConsoleVariables", sublen);
	if (SetSection (section))
	{
		ReadCVars (0);
	}

	strncpy (subsection, "ConsoleVariables", sublen);
	if (SetSection (section))
	{
		ReadCVars (0);
	}

	if (gameinfo.gametype & GAME_Raven)
	{
		SetRavenDefaults (gameinfo.gametype == GAME_Hexen);
	}

	// The NetServerInfo section will be read and override anything loaded
	// here when it's determined that a netgame is being played.
	strncpy (subsection, "LocalServerInfo", sublen);
	if (SetSection (section))
	{
		ReadCVars (0);
	}

	strncpy (subsection, "Player", sublen);
	if (SetSection (section))
	{
		ReadCVars (0);
	}

	strncpy (subsection, "ConsoleAliases", sublen);
	if (SetSection (section))
	{
		const char *name = NULL;
		while (NextInSection (key, value))
		{
			if (stricmp (key, "Name") == 0)
			{
				name = value;
			}
			else if (stricmp (key, "Command") == 0 && name != NULL)
			{
				C_SetAlias (name, value);
				name = NULL;
			}
		}
	}
	OkayToWrite = true;
}